

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

solution_t *
find_solution(solution_t *__return_storage_ptr__,map_t *m,nodes_list_t *nodes,int bombs,int rounds)

{
  size_t *__args;
  pointer *__return_storage_ptr___00;
  pointer pvVar1;
  pointer pvVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [8];
  undefined8 *puVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _Node *p_Var8;
  undefined1 auVar9 [8];
  list<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *plVar10;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  pointer *this;
  _List_node_base local_108;
  undefined1 local_f0 [8];
  flags_map_t flags;
  map_t m2;
  nodes_list_t n2;
  undefined1 local_90 [8];
  nodes_list_t pt;
  undefined1 local_68 [8];
  solution_t r;
  solution_t result;
  bool empty;
  
  r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node.
  _M_size = (size_t)&r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl._M_node._M_size;
  result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  pt.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node.
  _M_size = (size_t)m;
  result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  _M_node.super__List_node_base._M_next =
       (_List_node_base *)
       r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       _M_node._M_size;
  if (bombs == 0) {
    if ((rounds != 0) &&
       ((nodes->super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
        _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)nodes))
    goto LAB_00103d7b;
  }
  else if (rounds != 0) {
LAB_00103d7b:
    if (seen_abi_cxx11_.
        super__List_base<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&seen_abi_cxx11_) {
      plVar10 = &solutions_abi_cxx11_;
      p_Var6 = seen_abi_cxx11_.
               super__List_base<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      do {
        plVar10 = (list<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   *)(((_List_base<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                        *)&((_List_node_base *)plVar10)->_M_next)->_M_impl)._M_node.
                     super__List_node_base._M_next;
        if (p_Var6[2]._M_next ==
            (_List_node_base *)
            (nodes->super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
            _M_impl._M_node._M_size) {
          p_Var7 = p_Var6 + 1;
          p_Var11 = p_Var7;
          p_Var12 = (_List_node_base *)nodes;
          do {
            p_Var12 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       &p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            p_Var11 = p_Var11->_M_next;
            if (((p_Var11 == p_Var7) || (p_Var12 == (_List_node_base *)nodes)) ||
               (*(int *)&p_Var11[1]._M_next != *(int *)&p_Var12[1]._M_next)) break;
          } while (*(int *)((long)&p_Var11[1]._M_next + 4) ==
                   *(int *)((long)&p_Var12[1]._M_next + 4));
          if (p_Var12 == (_List_node_base *)nodes && p_Var11 == p_Var7) {
            std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
                      (__return_storage_ptr__,
                       (list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       ((long)plVar10 + 0x10));
            goto LAB_00104151;
          }
        }
        p_Var6 = (((_List_base<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var6 != (_List_node_base *)&seen_abi_cxx11_);
    }
    build_flags_map((flags_map_t *)local_f0,m,nodes,
                    (bool *)((long)&result.
                                    super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl._M_node._M_size + 6));
    get_possible_turns_abi_cxx11_((nodes_list_t *)local_90,(flags_map_t *)local_f0);
    if (local_90 != (undefined1  [8])local_90) {
      result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      _M_node._M_size._7_1_ = 1 < rounds && 1 < bombs;
      __return_storage_ptr___00 =
           &m2.
            super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      auVar9 = local_90;
      do {
        this = &flags.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
        local_68 = (undefined1  [8])local_68;
        r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        _M_node.super__List_node_base._M_next = (_List_node_base *)local_68;
        std::
        vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
        ::vector((vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                  *)this,(vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                          *)pt.
                            super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl._M_node._M_size);
        p_Var6 = (_List_node_base *)((long)auVar9 + 0x10);
        explode((map_t *)this,(node_t *)p_Var6);
        get_nodes_abi_cxx11_((nodes_list_t *)__return_storage_ptr___00,(map_t *)this);
        if (m2.
            super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)__return_storage_ptr___00
           ) {
          p_Var7 = (_List_node_base *)operator_new(0x18);
          p_Var7[1]._M_next = p_Var6->_M_next;
          std::__detail::_List_node_base::_M_hook(p_Var7);
          r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          _M_node.super__List_node_base._M_prev =
               (_List_node_base *)
               ((long)&(r.
                        super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
LAB_00104021:
          std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          _M_assign_dispatch<std::_List_const_iterator<std::pair<int,int>>>
                    ((list<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     &r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl._M_node._M_size,local_68,(_List_node_base *)local_68);
          while (m2.
                 super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                 (pointer)__return_storage_ptr___00) {
            pvVar2 = (pointer)((m2.
                                super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                              super__Vector_base<EType,_std::allocator<EType>_>)._M_impl.
                              super__Vector_impl_data._M_start;
            operator_delete(m2.
                            super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0x18);
            m2.
            super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar2;
          }
          std::
          vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
          ::~vector((vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                     *)&flags.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          auVar9 = local_68;
          while (auVar9 != (undefined1  [8])local_68) {
            p_Var6 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      &((_List_node_base *)auVar9)->_M_next)->_M_impl)._M_node.super__List_node_base
                     ._M_next;
            operator_delete((void *)auVar9,0x18);
            auVar9 = (undefined1  [8])p_Var6;
          }
          break;
        }
        if (result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl._M_node._M_size._7_1_ != '\0') {
          find_solution((solution_t *)&local_108,(map_t *)this,
                        (nodes_list_t *)__return_storage_ptr___00,bombs + -1,rounds + -1);
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
          _M_move_assign((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         local_68,&local_108);
          p_Var7 = local_108._M_next;
          if (local_108._M_next != &local_108) {
            do {
              p_Var12 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         &p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
              operator_delete(p_Var7,0x18);
              p_Var7 = p_Var12;
            } while (p_Var12 != &local_108);
          }
          if (local_68 != (undefined1  [8])local_68) {
            p_Var7 = (_List_node_base *)operator_new(0x18);
            p_Var7[1]._M_next = p_Var6->_M_next;
            std::__detail::_List_node_base::_M_hook(p_Var7);
            r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            _M_node.super__List_node_base._M_prev =
                 (_List_node_base *)
                 ((long)&(r.
                          super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
          }
          if ((((size_t *)
                r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl._M_node._M_size ==
                &r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl._M_node._M_size) && (local_68 != (undefined1  [8])local_68)) ||
             ((local_68 != (undefined1  [8])local_68 &&
              (r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl._M_node.super__List_node_base._M_prev <
               result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl._M_node.super__List_node_base._M_prev)))) goto LAB_00104021;
        }
        pvVar2 = m2.
                 super__Vector_base<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        while (pvVar2 != (pointer)__return_storage_ptr___00) {
          pvVar1 = (pointer)(pvVar2->super__Vector_base<EType,_std::allocator<EType>_>)._M_impl.
                            super__Vector_impl_data._M_start;
          operator_delete(pvVar2,0x18);
          pvVar2 = pvVar1;
        }
        std::
        vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
        ::~vector((vector<std::vector<EType,_std::allocator<EType>_>,_std::allocator<std::vector<EType,_std::allocator<EType>_>_>_>
                   *)&flags.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        auVar4 = local_68;
        while (auVar4 != (undefined1  [8])local_68) {
          p_Var6 = ((_List_node_base *)auVar4)->_M_next;
          operator_delete((void *)auVar4,0x18);
          auVar4 = (undefined1  [8])p_Var6;
        }
        auVar9 = (undefined1  [8])((_List_node_base *)auVar9)->_M_next;
      } while (auVar9 != (undefined1  [8])local_90);
    }
    p_Var8 = std::__cxx11::
             list<std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
             ::
             _M_create_node<std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>const&>
                       ((list<std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                         *)&seen_abi_cxx11_,nodes);
    std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
    seen_abi_cxx11_.
    super__List_base<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
    ._M_impl._M_node._M_size =
         seen_abi_cxx11_.
         super__List_base<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
         ._M_impl._M_node._M_size + 1;
    __args = &r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              ._M_node._M_size;
    p_Var8 = std::__cxx11::
             list<std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
             ::
             _M_create_node<std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>const&>
                       ((list<std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                         *)&solutions_abi_cxx11_,
                        (list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)__args);
    std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
    solutions_abi_cxx11_.
    super__List_base<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
    ._M_impl._M_node._M_size =
         solutions_abi_cxx11_.
         super__List_base<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
         ._M_impl._M_node._M_size + 1;
    (__return_storage_ptr__->
    super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl._M_node.
    super__List_node_base._M_next =
         (_List_node_base *)
         r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         _M_node._M_size;
    (__return_storage_ptr__->
    super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl._M_node.
    super__List_node_base._M_prev =
         result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
         ._M_node.super__List_node_base._M_next;
    (__return_storage_ptr__->
    super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl._M_node.
    _M_size = (size_t)result.
                      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                      _M_impl._M_node.super__List_node_base._M_prev;
    if ((size_t *)
        r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        _M_node._M_size == __args) {
      (__return_storage_ptr__->
      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl._M_node.
      super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
      (__return_storage_ptr__->
      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
    }
    else {
      (result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       _M_node.super__List_node_base._M_next)->_M_next = (_List_node_base *)__return_storage_ptr__;
      ((__return_storage_ptr__->
       super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl._M_node
       .super__List_node_base._M_next)->_M_prev = (_List_node_base *)__return_storage_ptr__;
      result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node
      ._M_size = (size_t)__args;
      result.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      _M_node.super__List_node_base._M_next = (_List_node_base *)__args;
    }
    while (local_90 != (undefined1  [8])local_90) {
      p_Var6 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                &((_List_node_base *)local_90)->_M_next)->_M_impl)._M_node.super__List_node_base.
               _M_next;
      operator_delete((void *)local_90,0x18);
      local_90 = (undefined1  [8])p_Var6;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_f0);
    goto LAB_00104151;
  }
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl._M_node.
  _M_size = 0;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
LAB_00104151:
  puVar5 = (undefined8 *)
           r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           _M_node._M_size;
  while (puVar5 != &r.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl._M_node._M_size) {
    puVar3 = (undefined8 *)*puVar5;
    operator_delete(puVar5,0x18);
    puVar5 = puVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

solution_t find_solution(const map_t& m, nodes_list_t& nodes, int bombs, int rounds)
{
    bool empty;
    solution_t result;

    if ((0 == bombs && !nodes.empty())
        || 0 == rounds)
    {
        return result;
    }

    std::list<solution_t>::const_iterator j = solutions.begin();
    for (seen_t::const_iterator i = seen.begin(); i != seen.end(); i++, j++)
    {
        if (*i == nodes)
        {
            return *j;
        }
    }

    //std::cerr << "try solve: " << std::endl;
    //dump_map(m);

    flags_map_t flags = build_flags_map(m, nodes, empty);
    nodes_list_t pt = get_possible_turns(flags);
    //std::cerr << bombs << " " << std::endl;

    for (nodes_list_t::const_iterator i = pt.begin(); i != pt.end(); i++)
    {
        solution_t r;
        map_t m2 = m;
        explode(m2, *i);
        nodes_list_t n2 = get_nodes(m2);

        //std::cerr << bombs - 1 << " " << rounds - 1 << " ";
        //dump_nodes(n2);
        if (n2.empty())
        {
            r.push_back(*i);
            result = r;
            break;
        } else if (0 < bombs - 1 && 0 < rounds - 1)
        {
            r = find_solution(m2, n2, bombs - 1, rounds - 1);
            if (!r.empty())
            {
                r.push_front(*i);
            }
            if ((result.empty() && !r.empty()) || (!r.empty() && result.size() > r.size()))
            {
                result = r;
                break;
            }
        }
    }

    seen.push_back(nodes);
    solutions.push_back(result);
    return result;
}